

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

pointer __thiscall
google::
dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
::alloc_impl<google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::realloc_or_die
          (alloc_impl<google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_> *this,
          pointer ptr,size_type n)

{
  pointer ppVar1;
  ulong uVar2;
  pointer ppVar3;
  int iVar4;
  long lVar5;
  
  ppVar1 = (pointer)realloc(ptr,n * 8);
  if (ppVar1 != (pointer)0x0) {
    return ppVar1;
  }
  dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
  ::alloc_impl<google::libc_allocator_with_realloc<std::pair<int_const,A>>>::realloc_or_die();
  uVar2 = *(long *)(n + 0x38) - 1;
  ppVar3 = (pointer)(uVar2 & (long)ptr->first);
  iVar4 = *(int *)(*(long *)(n + 0x48) + (long)ppVar3 * 8);
  ppVar1 = (pointer)0xffffffffffffffff;
  if (*(int *)(n + 0x24) != iVar4) {
    lVar5 = 1;
    do {
      if ((*(long *)(n + 0x28) == 0) || (*(int *)(n + 0x20) != iVar4)) {
        if (ptr->first == iVar4) {
          return ppVar3;
        }
      }
      else if (ppVar1 == (pointer)0xffffffffffffffff) {
        ppVar1 = ppVar3;
      }
      ppVar3 = (pointer)((long)&ppVar3->first + lVar5 & uVar2);
      iVar4 = *(int *)(*(long *)(n + 0x48) + (long)ppVar3 * 8);
      lVar5 = lVar5 + 1;
    } while (*(int *)(n + 0x24) != iVar4);
  }
  return (pointer)0xffffffffffffffff;
}

Assistant:

pointer realloc_or_die(pointer ptr, size_type n) {
      pointer retval = this->reallocate(ptr, n);
      if (retval == NULL) {
        fprintf(stderr,
                "sparsehash: FATAL ERROR: failed to reallocate "
                "%lu elements for ptr %p",
                static_cast<unsigned long>(n), static_cast<void*>(ptr));
        exit(1);
      }
      return retval;
    }